

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> * __thiscall
tinyusdz::prim::(anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
          (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *__return_storage_ptr__,
          _anonymous_namespace_ *this,PrimVar *var)

{
  TimeSamples *this_00;
  bool bVar1;
  undefined7 extraout_var;
  optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *poVar2;
  ulong uVar3;
  optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *extraout_RAX;
  undefined8 uVar4;
  long lVar5;
  pointer pSVar6;
  ulong uVar7;
  optional<std::array<float,_2UL>_> pv;
  optional<std::array<float,_2UL>_> local_7c;
  storage_t<std::array<float,_2UL>_> local_70;
  undefined2 local_68;
  TypedTimeSamples<std::array<float,_2UL>_> local_60;
  optional<std::array<float,_2UL>_> local_3c;
  
  local_70 = (storage_t<std::array<float,_2UL>_>)0x0;
  local_68 = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_60._dirty = false;
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)this);
  poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
LAB_0025cac5:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    return poVar2;
  }
  if ((((this[0x18] == (_anonymous_namespace_)0x0) &&
       (*(undefined8 **)(this + 0x10) != (undefined8 *)0x0)) &&
      ((poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                 (*(code *)**(undefined8 **)(this + 0x10))(), (int)poVar2 == 0 ||
       ((*(undefined8 **)(this + 0x10) != (undefined8 *)0x0 &&
        (poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                  (*(code *)**(undefined8 **)(this + 0x10))(), (int)poVar2 == 1)))))) ||
     (poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
               primvar::PrimVar::get_value<std::array<float,2ul>>(&local_7c,(PrimVar *)this),
     local_7c.has_value_ == false)) {
    pSVar6 = *(pointer *)(this + 0x20);
    if (*(pointer *)(this + 0x28) == pSVar6) goto LAB_0025cac5;
  }
  else {
    local_70 = local_7c.contained;
    local_68 = 1;
    pSVar6 = *(pointer *)(this + 0x20);
    if (*(pointer *)(this + 0x28) == pSVar6) {
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0;
      uVar4 = 0;
      goto LAB_0025caa3;
    }
  }
  this_00 = (TimeSamples *)(this + 0x20);
  lVar5 = 0;
  uVar7 = 0;
  do {
    if (this[0x38] == (_anonymous_namespace_)0x1) {
      tinyusdz::value::TimeSamples::update(this_00);
      pSVar6 = (this_00->_samples).
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((&pSVar6->blocked)[lVar5] == true) {
      TypedTimeSamples<std::array<float,_2UL>_>::add_blocked_sample
                (&local_60,*(double *)((long)&pSVar6->t + lVar5));
    }
    else {
      tinyusdz::value::Value::get_value<std::array<float,2ul>>
                (&local_3c,(Value *)((long)&(pSVar6->value).v_ + lVar5),false);
      local_7c.has_value_ = local_3c.has_value_;
      if (local_3c.has_value_ != true) {
        __return_storage_ptr__->has_value_ = false;
        *(undefined8 *)&__return_storage_ptr__->contained = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
        if (local_60._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(local_60._samples.
                                   super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   local_60._samples.
                                   super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                          (long)local_60._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          return extraout_RAX;
        }
        return __return_storage_ptr__;
      }
      local_7c.contained = local_3c.contained;
      TypedTimeSamples<std::array<float,_2UL>_>::add_sample
                (&local_60,*(double *)((long)&pSVar6->t + lVar5),
                 (array<float,_2UL> *)&local_7c.contained);
    }
    uVar7 = uVar7 + 1;
    pSVar6 = (this_00->_samples).
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (*(long *)(this + 0x28) - (long)pSVar6 >> 3) * -0x3333333333333333;
    lVar5 = lVar5 + 0x28;
  } while (uVar7 < uVar3);
  uVar4 = CONCAT71(local_60._samples.
                   super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                   local_60._samples.
                   super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  poVar2 = (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
           CONCAT71((int7)(uVar3 >> 8),local_60._dirty);
LAB_0025caa3:
  __return_storage_ptr__->has_value_ = true;
  *(storage_t<std::array<float,_2UL>_> *)&__return_storage_ptr__->contained = local_70;
  *(undefined2 *)((long)&__return_storage_ptr__->contained + 8) = local_68;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x10) =
       local_60._samples.
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x14) =
       local_60._samples.
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x18) =
       local_60._samples.
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x1c) =
       local_60._samples.
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = uVar4;
  *(char *)((long)&__return_storage_ptr__->contained + 0x28) = (char)poVar2;
  return poVar2;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}